

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_reader.h
# Opt level: O0

void MyGame_Example_Any_sort(MyGame_Example_Any_mutable_union_t u)

{
  MyGame_Example_Any_mutable_union_t u_local;
  
  if (u.type == '\x01') {
    MyGame_Example_Monster_sort((MyGame_Example_Monster_mutable_table_t)u.value);
  }
  else if (u.type == '\x04') {
    MyGame_Example_Alt_sort((MyGame_Example_Alt_mutable_table_t)u.value);
  }
  return;
}

Assistant:

static void MyGame_Example_Any_sort(MyGame_Example_Any_mutable_union_t u)
{
    switch (u.type) {
    case MyGame_Example_Any_Monster: MyGame_Example_Monster_sort(u.value); break;
    case MyGame_Example_Any_Alt: MyGame_Example_Alt_sort(u.value); break;
    default: break;
    }
}